

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

void __thiscall
QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate(QDtlsClientVerifierPrivate *this)

{
  bool bVar1;
  QTlsBackend *this_00;
  QObjectPrivate *t;
  pointer pDVar2;
  QObjectPrivate *in_RDI;
  long in_FS_OFFSET;
  QTlsBackend *tlsBackend;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff48;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff50;
  int line;
  char *in_stack_ffffffffffffff58;
  undefined1 local_88 [32];
  char *in_stack_ffffffffffffff98;
  QDebug local_50;
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QDtlsClientVerifierPrivate_004a0c00;
  std::
  unique_ptr<QTlsPrivate::DtlsCookieVerifier,std::default_delete<QTlsPrivate::DtlsCookieVerifier>>::
  unique_ptr<std::default_delete<QTlsPrivate::DtlsCookieVerifier>,void>
            ((unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
              *)in_stack_ffffffffffffff50);
  this_00 = QSslSocketPrivate::tlsBackendInUse();
  if (this_00 == (QTlsBackend *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3b8e8a);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,in_stack_ffffffffffffff58,
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(char *)in_stack_ffffffffffffff48,
                 (char *)0x3b8ea0);
      QMessageLogger::warning(local_48,"No TLS backend is available, cannot verify DTLS client");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    t = in_RDI + 0x78;
    (**(code **)(*(long *)this_00 + 0xd8))();
    std::
    unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
    ::reset((unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
             *)in_stack_ffffffffffffff50,(pointer)in_stack_ffffffffffffff48);
    pDVar2 = std::
             unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
             ::get((unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
                    *)0x3b8ef9);
    if (pDVar2 == (pointer)0x0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      while( true ) {
        line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_ad805c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3b8f59);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RDI,(char *)t,line,(char *)in_stack_ffffffffffffff48,
                   (char *)0x3b8f6f);
        QMessageLogger::warning();
        in_stack_ffffffffffffff50 =
             (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
             QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff98);
        (**(code **)(*(long *)this_00 + 0x90))(local_88);
        QDebug::operator<<((QDebug *)in_RDI,(QString *)t);
        QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff98);
        QString::~QString((QString *)0x3b8fcf);
        QDebug::~QDebug(&local_50);
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate()
{
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available, cannot verify DTLS client");
        return;
    }
    backend.reset(tlsBackend->createDtlsCookieVerifier());
    if (!backend.get())
        qCWarning(lcSsl) << "The backend" << tlsBackend->backendName() << "does not support DTLS cookies";
}